

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_Erase_Test<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Erase_Test<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  iterator it_00;
  iterator f;
  iterator l;
  bool bVar1;
  long lVar2;
  pointer piVar3;
  long lVar4;
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *this_00;
  long lVar5;
  AssertHelper *this_01;
  long in_RDI;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  int i;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_;
  iterator it;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  bool *in_stack_fffffffffffffb58;
  dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *pdVar6;
  HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffb60;
  HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *this_02;
  AssertHelper *this_03;
  uint *in_stack_fffffffffffffb68;
  uint *puVar7;
  char *in_stack_fffffffffffffb70;
  char *in_stack_fffffffffffffb78;
  int iVar8;
  char *in_stack_fffffffffffffb80;
  Type in_stack_fffffffffffffb8c;
  AssertHelper *in_stack_fffffffffffffb90;
  key_type *in_stack_fffffffffffffb98;
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffba0;
  undefined8 in_stack_fffffffffffffbb0;
  pointer in_stack_fffffffffffffbc0;
  char *in_stack_fffffffffffffbc8;
  AssertionResult *in_stack_fffffffffffffbd8;
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffbe0;
  pointer in_stack_fffffffffffffbf0;
  char *in_stack_fffffffffffffbf8;
  AssertionResult local_3a8;
  char *local_398;
  char *local_390;
  char *local_388;
  char *local_378;
  char *local_370;
  char *local_368;
  undefined8 local_360;
  AssertHelper *local_358;
  uint *local_350;
  undefined8 local_340;
  AssertHelper *local_338;
  uint *local_330;
  size_type local_318;
  undefined4 local_30c;
  AssertionResult local_308 [3];
  value_type local_2d0;
  int local_2cc;
  size_type local_2b8;
  undefined4 local_2ac;
  AssertionResult local_2a8;
  dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *local_298;
  HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *local_290;
  uint *local_288;
  string local_280 [48];
  const_iterator local_250;
  undefined1 local_229;
  AssertionResult local_228;
  key_type local_214;
  dense_hashtable_const_iterator<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_210 [2];
  size_type local_1e0;
  undefined4 local_1d4;
  AssertionResult local_1d0 [2];
  key_type local_1ac;
  size_type local_1a8;
  undefined4 local_19c;
  AssertionResult local_198 [2];
  size_type local_178;
  undefined4 local_16c;
  AssertionResult local_168 [2];
  key_type local_144;
  size_type local_140;
  undefined4 local_134;
  AssertionResult local_130 [2];
  size_type local_110;
  undefined4 local_104;
  AssertionResult local_100 [2];
  key_type local_dc;
  size_type local_d8;
  undefined4 local_cc;
  AssertionResult local_c8 [3];
  value_type local_8c;
  value_type local_5c;
  key_type local_34;
  size_type local_30;
  undefined4 local_24;
  AssertionResult local_20;
  key_type local_c;
  
  local_c = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey(in_stack_fffffffffffffb60,(int)((ulong)in_stack_fffffffffffffb58 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                     *)in_stack_fffffffffffffb60,(key_type *)in_stack_fffffffffffffb58);
  local_24 = 0;
  local_34 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey(in_stack_fffffffffffffb60,(int)((ulong)in_stack_fffffffffffffb58 >> 0x20));
  local_30 = google::
             BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::erase((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)in_stack_fffffffffffffb60,(key_type *)in_stack_fffffffffffffb58);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffffb78,in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
             (unsigned_long *)in_stack_fffffffffffffb60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_20);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb90);
    testing::AssertionResult::failure_message((AssertionResult *)0xe81d33);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffb90,in_stack_fffffffffffffb8c,in_stack_fffffffffffffb80,
               (int)((ulong)in_stack_fffffffffffffb78 >> 0x20),in_stack_fffffffffffffb70);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffbe0,(Message *)in_stack_fffffffffffffbd8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb60);
    testing::Message::~Message((Message *)0xe81d96);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe81e07);
  lVar2 = in_RDI + 0x10;
  local_5c = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueObject(in_stack_fffffffffffffb60,
                            (int)((ulong)in_stack_fffffffffffffb58 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffbe0,(value_type *)in_stack_fffffffffffffbd8);
  piVar3 = (pointer)(in_RDI + 0x10);
  local_8c = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueObject(in_stack_fffffffffffffb60,
                            (int)((ulong)in_stack_fffffffffffffb58 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffbe0,(value_type *)in_stack_fffffffffffffbd8);
  local_cc = 1;
  local_dc = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey(in_stack_fffffffffffffb60,(int)((ulong)in_stack_fffffffffffffb58 >> 0x20));
  local_d8 = google::
             BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::erase((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)in_stack_fffffffffffffb60,(key_type *)in_stack_fffffffffffffb58);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffffb78,in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
             (unsigned_long *)in_stack_fffffffffffffb60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_c8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb90);
    in_stack_fffffffffffffbf8 =
         testing::AssertionResult::failure_message((AssertionResult *)0xe81f52);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffb90,in_stack_fffffffffffffb8c,in_stack_fffffffffffffb80,
               (int)((ulong)in_stack_fffffffffffffb78 >> 0x20),in_stack_fffffffffffffb70);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffbe0,(Message *)in_stack_fffffffffffffbd8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb60);
    testing::Message::~Message((Message *)0xe81fb5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe82023);
  local_104 = 1;
  local_110 = google::
              BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xe8203f);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffffb78,in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
             (unsigned_long *)in_stack_fffffffffffffb60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_100);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb90);
    in_stack_fffffffffffffbf0 =
         (pointer)testing::AssertionResult::failure_message((AssertionResult *)0xe820b8);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffb90,in_stack_fffffffffffffb8c,in_stack_fffffffffffffb80,
               (int)((ulong)in_stack_fffffffffffffb78 >> 0x20),in_stack_fffffffffffffb70);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffbe0,(Message *)in_stack_fffffffffffffbd8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb60);
    testing::Message::~Message((Message *)0xe8211b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe8218c);
  local_134 = 0;
  lVar4 = in_RDI + 0x10;
  local_144 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffffb60,(int)((ulong)in_stack_fffffffffffffb58 >> 0x20))
  ;
  local_140 = google::
              BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::erase((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffffb60,(key_type *)in_stack_fffffffffffffb58);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffffb78,in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
             (unsigned_long *)in_stack_fffffffffffffb60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_130);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb90);
    in_stack_fffffffffffffbe0 =
         (BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)testing::AssertionResult::failure_message((AssertionResult *)0xe8224d);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffb90,in_stack_fffffffffffffb8c,in_stack_fffffffffffffb80,
               (int)((ulong)in_stack_fffffffffffffb78 >> 0x20),in_stack_fffffffffffffb70);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffbe0,(Message *)in_stack_fffffffffffffbd8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb60);
    testing::Message::~Message((Message *)0xe822b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe8231e);
  local_16c = 1;
  local_178 = google::
              BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xe8233a);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffffb78,in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
             (unsigned_long *)in_stack_fffffffffffffb60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_168);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb90);
    in_stack_fffffffffffffbd8 =
         (AssertionResult *)testing::AssertionResult::failure_message((AssertionResult *)0xe823b3);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffb90,in_stack_fffffffffffffb8c,in_stack_fffffffffffffb80,
               (int)((ulong)in_stack_fffffffffffffb78 >> 0x20),in_stack_fffffffffffffb70);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffbe0,(Message *)in_stack_fffffffffffffbd8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb60);
    testing::Message::~Message((Message *)0xe82416);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe82487);
  local_19c = 0;
  this_00 = (BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             *)(in_RDI + 0x10);
  local_1ac = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffffb60,(int)((ulong)in_stack_fffffffffffffb58 >> 0x20))
  ;
  local_1a8 = google::
              BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::erase((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffffb60,(key_type *)in_stack_fffffffffffffb58);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffffb78,in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
             (unsigned_long *)in_stack_fffffffffffffb60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_198);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb90);
    in_stack_fffffffffffffbc8 =
         testing::AssertionResult::failure_message((AssertionResult *)0xe82542);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffb90,in_stack_fffffffffffffb8c,in_stack_fffffffffffffb80,
               (int)((ulong)in_stack_fffffffffffffb78 >> 0x20),in_stack_fffffffffffffb70);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffbe0,(Message *)in_stack_fffffffffffffbd8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb60);
    testing::Message::~Message((Message *)0xe8259f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe8260d);
  local_1d4 = 1;
  local_1e0 = google::
              BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xe82629);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffffb78,in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
             (unsigned_long *)in_stack_fffffffffffffb60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1d0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb90);
    in_stack_fffffffffffffbc0 =
         (pointer)testing::AssertionResult::failure_message((AssertionResult *)0xe826a2);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffb90,in_stack_fffffffffffffb8c,in_stack_fffffffffffffb80,
               (int)((ulong)in_stack_fffffffffffffb78 >> 0x20),in_stack_fffffffffffffb70);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffbe0,(Message *)in_stack_fffffffffffffbd8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb60);
    testing::Message::~Message((Message *)0xe826ff);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe82770);
  lVar5 = in_RDI + 0x10;
  local_214 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffffb60,(int)((ulong)in_stack_fffffffffffffb58 >> 0x20))
  ;
  google::
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  google::
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_fffffffffffffba0);
  local_229 = google::
              dense_hashtable_const_iterator<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=(local_210,&local_250);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,(type *)0xe827ff
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_228);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffbd8,(char *)this_00,in_stack_fffffffffffffbc8,
               (char *)in_stack_fffffffffffffbc0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffb90,in_stack_fffffffffffffb8c,in_stack_fffffffffffffb80,
               (int)((ulong)in_stack_fffffffffffffb78 >> 0x20),in_stack_fffffffffffffb70);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffbe0,(Message *)in_stack_fffffffffffffbd8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb60);
    std::__cxx11::string::~string(local_280);
    testing::Message::~Message((Message *)0xe828d2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe82969);
  local_298 = local_210[0].ht;
  local_290 = (HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               *)local_210[0].pos;
  local_288 = (uint *)local_210[0].end;
  it_00.pos = (pointer)lVar5;
  it_00.ht = (dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)in_stack_fffffffffffffbb0;
  it_00.end = in_stack_fffffffffffffbc0;
  google::
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::erase(in_stack_fffffffffffffba0,it_00);
  local_2ac = 0;
  local_2b8 = google::
              BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xe829e7);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffffb78,in_stack_fffffffffffffb70,(uint *)local_210[0].end,
             (unsigned_long *)local_210[0].pos);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2a8);
  pdVar6 = local_210[0].ht;
  this_02 = (HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             *)local_210[0].pos;
  puVar7 = (uint *)local_210[0].end;
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb90);
    testing::AssertionResult::failure_message((AssertionResult *)0xe82a60);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffb90,in_stack_fffffffffffffb8c,in_stack_fffffffffffffb80,
               (int)((ulong)in_stack_fffffffffffffb78 >> 0x20),in_stack_fffffffffffffb70);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffbe0,(Message *)in_stack_fffffffffffffbd8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_210[0].pos);
    testing::Message::~Message((Message *)0xe82abd);
    pdVar6 = local_210[0].ht;
    this_02 = (HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               *)local_210[0].pos;
    puVar7 = (uint *)local_210[0].end;
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe82b2b);
  for (local_2cc = 10; local_2cc < 100; local_2cc = local_2cc + 1) {
    local_2d0 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject(this_02,(int)((ulong)pdVar6 >> 0x20));
    google::
    BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffffbe0,(value_type *)in_stack_fffffffffffffbd8);
  }
  local_30c = 0x5a;
  local_318 = google::
              BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xe82bc2);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffffb78,in_stack_fffffffffffffb70,puVar7,(unsigned_long *)this_02);
  iVar8 = (int)((ulong)in_stack_fffffffffffffb78 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_308);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb90);
    in_stack_fffffffffffffba0 =
         (BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)testing::AssertionResult::failure_message((AssertionResult *)0xe82c29);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffb90,in_stack_fffffffffffffb8c,in_stack_fffffffffffffb80,iVar8,
               in_stack_fffffffffffffb70);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffbe0,(Message *)in_stack_fffffffffffffbd8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
    testing::Message::~Message((Message *)0xe82c86);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe82cf7);
  google::
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::begin(in_stack_fffffffffffffba0);
  local_340 = local_360;
  local_338 = local_358;
  local_330 = local_350;
  google::
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_fffffffffffffba0);
  local_378 = local_398;
  local_370 = local_390;
  local_368 = local_388;
  f.pos = (pointer)lVar4;
  f.ht = (dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          *)in_stack_fffffffffffffbe0;
  f.end = in_stack_fffffffffffffbf0;
  l.pos = (pointer)lVar2;
  l.ht = (dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          *)in_stack_fffffffffffffbf8;
  l.end = piVar3;
  this_03 = local_338;
  puVar7 = local_330;
  google::
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::erase(this_00,f,l);
  google::
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::size((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)0xe82dfe);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (local_390,local_398,puVar7,(unsigned_long *)this_03);
  iVar8 = (int)((ulong)local_390 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3a8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb90);
    this_01 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0xe82e77)
    ;
    testing::internal::AssertHelper::AssertHelper
              (this_01,in_stack_fffffffffffffb8c,local_388,iVar8,local_398);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffbe0,(Message *)in_stack_fffffffffffffbd8);
    testing::internal::AssertHelper::~AssertHelper(this_03);
    testing::Message::~Message((Message *)0xe82ed4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe82f3f);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Erase) {
  this->ht_.set_deleted_key(this->UniqueKey(1));
  EXPECT_EQ(0u, this->ht_.erase(this->UniqueKey(20)));
  this->ht_.insert(this->UniqueObject(10));
  this->ht_.insert(this->UniqueObject(20));
  EXPECT_EQ(1u, this->ht_.erase(this->UniqueKey(20)));
  EXPECT_EQ(1u, this->ht_.size());
  EXPECT_EQ(0u, this->ht_.erase(this->UniqueKey(20)));
  EXPECT_EQ(1u, this->ht_.size());
  EXPECT_EQ(0u, this->ht_.erase(this->UniqueKey(19)));
  EXPECT_EQ(1u, this->ht_.size());

  typename TypeParam::iterator it = this->ht_.find(this->UniqueKey(10));
  EXPECT_TRUE(it != this->ht_.end());
  this->ht_.erase(it);
  EXPECT_EQ(0u, this->ht_.size());

  for (int i = 10; i < 100; i++) this->ht_.insert(this->UniqueObject(i));
  EXPECT_EQ(90u, this->ht_.size());
  this->ht_.erase(this->ht_.begin(), this->ht_.end());
  EXPECT_EQ(0u, this->ht_.size());
}